

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReportErrorIfHasExtraArraynessForOtherEntry
          (InterfaceVariableScalarReplacement *this,Instruction *var)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  long *plVar3;
  size_t *psVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  __hash_code __code;
  bool bVar8;
  string message;
  spv_position_t local_88;
  long lStack_70;
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  uVar1 = (this->vars_with_extra_arrayness)._M_h._M_bucket_count;
  uVar5 = (ulong)var % uVar1;
  p_Var6 = (this->vars_with_extra_arrayness)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, (Instruction *)p_Var6->_M_nxt[1]._M_nxt != var)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, (Instruction *)p_Var2[1]._M_nxt == var)) goto LAB_00230338;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00230338:
  if (p_Var7 == (__node_base_ptr)0x0) {
    bVar8 = true;
  }
  else {
    bVar8 = p_Var7->_M_nxt == (_Hash_node_base *)0x0;
  }
  if (bVar8 == false) {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,
               "A variable is arrayed for an entry point but it is not arrayed for another entry point"
               ,"");
    Instruction::PrettyPrint_abi_cxx11_(&local_48,var,0x40);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x345675);
    psVar4 = (size_t *)(plVar3 + 2);
    if ((size_t *)*plVar3 == psVar4) {
      local_88.index = *psVar4;
      lStack_70 = plVar3[3];
      local_88.line = (size_t)&local_88.index;
    }
    else {
      local_88.index = *psVar4;
      local_88.line = (size_t)*plVar3;
    }
    local_88.column = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_68,local_88.line);
    if ((size_t *)local_88.line != &local_88.index) {
      operator_delete((void *)local_88.line,local_88.index + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_88.line = 0;
    local_88.column = 0;
    local_88.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&((this->super_Pass).context_)->consumer_,SPV_MSG_ERROR,"",&local_88,
               (char *)local_68[0]);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
  }
  return (bool)(bVar8 ^ 1);
}

Assistant:

bool InterfaceVariableScalarReplacement::
    ReportErrorIfHasExtraArraynessForOtherEntry(Instruction* var) {
  if (vars_with_extra_arrayness.find(var) == vars_with_extra_arrayness.end())
    return false;

  std::string message(
      "A variable is arrayed for an entry point but it is not "
      "arrayed for another entry point");
  message +=
      "\n  " + var->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
  context()->consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
  return true;
}